

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib536.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  CURLM *multi;
  long lVar5;
  char *pcVar6;
  
  tv_test_start = tutil_tvnow();
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    uVar4 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                  ,0x56,iVar2,uVar4);
  }
  if (iVar2 != 0) goto LAB_00102583;
  multi = (CURLM *)curl_multi_init();
  if (multi == (CURLM *)0x0) {
    curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                  ,0x58);
    iVar2 = 0x7b;
    lVar5 = 0;
  }
  else {
    lVar5 = curl_easy_init();
    if (lVar5 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                    ,0x5a);
      iVar2 = 0x7c;
    }
    else {
      iVar3 = curl_multi_setopt(multi,3,1);
      uVar1 = _stderr;
      iVar2 = 0;
      if (iVar3 != 0) {
        uVar4 = curl_multi_strerror(iVar3);
        curl_mfprintf(uVar1,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                      ,0x5c,iVar3,uVar4);
        iVar2 = iVar3;
      }
      if (iVar2 == 0) {
        iVar3 = curl_easy_setopt(lVar5,0x4e2b,fwrite);
        uVar1 = _stderr;
        iVar2 = 0;
        if (iVar3 != 0) {
          uVar4 = curl_easy_strerror(iVar3);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                        ,0x5e,iVar3,uVar4);
          iVar2 = iVar3;
        }
        if (iVar2 == 0) {
          iVar3 = curl_easy_setopt(lVar5,0x2d,1);
          uVar1 = _stderr;
          iVar2 = 0;
          if (iVar3 != 0) {
            uVar4 = curl_easy_strerror(iVar3);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                          ,0x5f,iVar3,uVar4);
            iVar2 = iVar3;
          }
          if (iVar2 == 0) {
            iVar3 = curl_easy_setopt(lVar5,0x2712,URL);
            uVar1 = _stderr;
            iVar2 = 0;
            if (iVar3 != 0) {
              uVar4 = curl_easy_strerror(iVar3);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                            ,0x60,iVar3,uVar4);
              iVar2 = iVar3;
            }
            if (iVar2 == 0) {
              iVar2 = curl_multi_add_handle(multi,lVar5);
              uVar1 = _stderr;
              if (iVar2 == 0) {
                iVar2 = 0;
              }
              else {
                uVar4 = curl_multi_strerror(iVar2);
                curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                              ,0x62,iVar2,uVar4);
              }
              if (iVar2 == 0) {
                iVar2 = perform(multi);
                if (iVar2 == 0) {
                  curl_multi_remove_handle(multi,lVar5);
                  curl_easy_reset(lVar5);
                  iVar3 = curl_easy_setopt(lVar5,0x2d,1);
                  uVar1 = _stderr;
                  iVar2 = 0;
                  if (iVar3 != 0) {
                    uVar4 = curl_easy_strerror(iVar3);
                    curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                                  ,0x72,iVar3,uVar4);
                    iVar2 = iVar3;
                  }
                  if (iVar2 == 0) {
                    iVar3 = curl_easy_setopt(lVar5,0x2712,libtest_arg2);
                    uVar1 = _stderr;
                    iVar2 = 0;
                    if (iVar3 != 0) {
                      uVar4 = curl_easy_strerror(iVar3);
                      curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                                    ,0x73,iVar3,uVar4);
                      iVar2 = iVar3;
                    }
                    if (iVar2 == 0) {
                      iVar2 = curl_multi_add_handle(multi,lVar5);
                      uVar1 = _stderr;
                      if (iVar2 == 0) {
                        iVar2 = 0;
                      }
                      else {
                        uVar4 = curl_multi_strerror(iVar2);
                        curl_mfprintf(uVar1,
                                      "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                                      ,0x75,iVar2,uVar4);
                      }
                      if (iVar2 == 0) {
                        iVar2 = perform(multi);
                        if (iVar2 == 0) {
                          curl_multi_remove_handle(multi,lVar5);
                          iVar2 = 0;
                          goto LAB_00102560;
                        }
                        pcVar6 = "retrieve 2 failed\n";
                      }
                      else {
                        pcVar6 = "curl_multi_add_handle() 2 failed\n";
                      }
                      goto LAB_001025b8;
                    }
                  }
                  goto LAB_00102560;
                }
                pcVar6 = "retrieve 1 failed\n";
              }
              else {
                pcVar6 = "curl_multi_add_handle() 1 failed\n";
              }
LAB_001025b8:
              curl_mprintf(pcVar6);
            }
          }
        }
      }
    }
  }
LAB_00102560:
  curl_easy_cleanup(lVar5);
  curl_multi_cleanup(multi);
  curl_global_cleanup();
  curl_mprintf("Finished!\n");
LAB_00102583:
  return iVar2;
}

Assistant:

int test(char *URL)
{
  CURLM *multi = NULL;
  CURL *easy = NULL;
  int res = 0;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(multi);

  easy_init(easy);

  multi_setopt(multi, CURLMOPT_PIPELINING, 1L);

  easy_setopt(easy, CURLOPT_WRITEFUNCTION, fwrite);
  easy_setopt(easy, CURLOPT_FAILONERROR, 1L);
  easy_setopt(easy, CURLOPT_URL, URL);

  res_multi_add_handle(multi, easy);
  if(res) {
    printf("curl_multi_add_handle() 1 failed\n");
    goto test_cleanup;
  }

  res = perform(multi);
  if(res) {
    printf("retrieve 1 failed\n");
    goto test_cleanup;
  }

  curl_multi_remove_handle(multi, easy);

  curl_easy_reset(easy);

  easy_setopt(easy, CURLOPT_FAILONERROR, 1L);
  easy_setopt(easy, CURLOPT_URL, libtest_arg2);

  res_multi_add_handle(multi, easy);
  if(res) {
    printf("curl_multi_add_handle() 2 failed\n");
    goto test_cleanup;
  }

  res = perform(multi);
  if(res) {
    printf("retrieve 2 failed\n");
    goto test_cleanup;
  }

  curl_multi_remove_handle(multi, easy);

test_cleanup:

  /* undocumented cleanup sequence - type UB */

  curl_easy_cleanup(easy);
  curl_multi_cleanup(multi);
  curl_global_cleanup();

  printf("Finished!\n");

  return res;
}